

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O2

TString * anon_unknown.dwarf_9f3a5a::AppendTypeName
                    (TString *s,char *argOrder,char *argType,int dim0,int dim1)

{
  byte argOrder_00;
  byte bVar1;
  bool bVar2;
  char __c;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char __c_00;
  byte bVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte local_65;
  char *local_48;
  byte local_34;
  
  argOrder_00 = *argOrder;
  bVar10 = argOrder_00 != 0x5b;
  bVar11 = argOrder_00 == 0x7e;
  bVar12 = argOrder_00 != 0x2a;
  bVar13 = argOrder_00 == 0x5d;
  bVar2 = IsTextureType(argOrder_00);
  bVar1 = *argType;
  bVar14 = (argOrder_00 & 0xfd) == 0x21;
  iVar9 = dim0;
  iVar7 = dim1;
  if ((argOrder_00 == 0x5e) ||
     (((iVar9 = dim1, iVar7 = dim0, !bVar2 && (argOrder_00 != 0x5d)) && (argOrder_00 != 0x5b)))) {
LAB_00336721:
    local_48 = argOrder + (argOrder_00 == 0x5e);
    local_65 = argOrder[argOrder_00 == 0x5e];
    dim1 = iVar9;
    dim0 = iVar7;
    bVar8 = bVar1;
    switch(bVar1) {
    case 0x42:
      pcVar6 = "bool";
      break;
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
switchD_00336761_caseD_43:
      pcVar6 = "UNKNOWN_TYPE";
      break;
    case 0x44:
      pcVar6 = "double";
      break;
    case 0x46:
      pcVar6 = "float";
      break;
    case 0x49:
      pcVar6 = "int";
      break;
    case 0x4c:
      pcVar6 = "int64_t";
      break;
    case 0x4d:
      pcVar6 = "uint64_t";
      break;
    case 0x53:
      pcVar6 = "sampler";
      break;
    case 0x54:
switchD_00336761_caseD_54:
      pcVar6 = "Texture";
      if (bVar14 || bVar11) {
        pcVar6 = "RWTexture";
      }
      pcVar4 = "Buffer";
      if (bVar12 && !bVar11) {
        pcVar4 = pcVar6;
      }
      pcVar5 = "SubpassInput";
      if (bVar10 && !bVar13) {
        pcVar5 = pcVar4;
      }
      pcVar6 = "RWBuffer";
      if (argOrder_00 != 0x7e) {
        pcVar6 = pcVar5;
      }
      bVar8 = 0x54;
      iVar9 = dim1;
      iVar7 = dim0;
      break;
    case 0x55:
      pcVar6 = "uint";
      break;
    default:
      if (bVar1 == 0x2d) {
        pcVar6 = "void";
      }
      else {
        if (bVar1 == 0x69) goto LAB_0033684f;
        if (bVar1 != 0x73) {
          if (bVar1 == 0x75) goto LAB_003367e8;
          goto switchD_00336761_caseD_43;
        }
        pcVar6 = "SamplerComparisonState";
      }
    }
  }
  else {
    local_65 = argOrder_00;
    local_48 = argOrder;
    if (bVar1 == 0x46) goto switchD_00336761_caseD_54;
    if (bVar1 == 0x49) {
LAB_0033684f:
      pcVar6 = "Texture";
      if (bVar14 || bVar11) {
        pcVar6 = "RWTexture";
      }
      pcVar4 = "Buffer";
      if (bVar12 && !bVar11) {
        pcVar4 = pcVar6;
      }
      pcVar5 = "SubpassInput";
      if (bVar10 && !bVar13) {
        pcVar5 = pcVar4;
      }
      pcVar6 = "RWBuffer";
      if (argOrder_00 != 0x7e) {
        pcVar6 = pcVar5;
      }
      bVar8 = 0x69;
      iVar9 = dim1;
      iVar7 = dim0;
    }
    else {
      if (bVar1 != 0x55) goto LAB_00336721;
LAB_003367e8:
      pcVar6 = "Texture";
      if (bVar14 || bVar11) {
        pcVar6 = "RWTexture";
      }
      pcVar4 = "Buffer";
      if (bVar12 && !bVar11) {
        pcVar4 = pcVar6;
      }
      pcVar5 = "SubpassInput";
      if (bVar10 && !bVar13) {
        pcVar5 = pcVar4;
      }
      pcVar6 = "RWBuffer";
      if (argOrder_00 != 0x7e) {
        pcVar6 = pcVar5;
      }
      bVar8 = 0x75;
      iVar9 = dim1;
      iVar7 = dim0;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar6);
  if (argOrder_00 == 0x5d) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,"MS");
  }
  iVar3 = FixedVecSize(local_48);
  if (iVar3 != 0) {
    iVar9 = iVar3;
    iVar7 = iVar3;
  }
  __c = (char)iVar7 + '0';
  if ((~bVar2 & (bVar1 & 0xdf) != 0x53) == 0) {
    if ((((~bVar2 & local_65 != 0x56) == 0) && (argOrder_00 != 0x2a)) && (argOrder_00 != 0x7e)) {
      switch(iVar7) {
      case 1:
        pcVar6 = "1D";
        break;
      case 2:
        pcVar6 = "2D";
        if (bVar13 || (argOrder_00 & 0xfd) == 0x24) {
          pcVar6 = "2DMS";
        }
        break;
      case 3:
        pcVar6 = "3D";
        break;
      case 4:
        pcVar6 = "Cube";
        if (bVar8 == 0x53) {
          pcVar6 = "CUBE";
        }
        break;
      default:
        pcVar6 = "UNKNOWN_SAMPLER";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,pcVar6);
    }
  }
  else if ((local_65 == 0x56) || (local_65 == 0x4d)) {
    pcVar6 = "UNKNOWN_DIMENSION";
    if (iVar7 - 5U < 0xfffffffc) goto LAB_00336b35;
    __c_00 = __c;
    if (local_65 != 0x56) {
      if (local_65 != 0x4d) goto LAB_00336ad5;
      if (iVar9 - 5U < 0xfffffffc) goto LAB_00336b35;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      push_back(s,__c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      push_back(s,'x');
      __c_00 = (char)iVar9 + '0';
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    push_back(s,__c_00);
  }
LAB_00336ad5:
  local_34 = (byte)(0x20000009 >> (argOrder_00 - 0x23 & 0x1f));
  if (((byte)(argOrder_00 - 0x23) < 0x1e & local_34) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,"Array");
  }
  if (bVar8 == 0x54) {
    pcVar6 = "<float";
  }
  else if (bVar8 == 0x69) {
    pcVar6 = "<int";
  }
  else {
    if (bVar8 != 0x75) {
      return s;
    }
    pcVar6 = "<uint";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  push_back(s,__c);
  pcVar6 = ">";
LAB_00336b35:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar6);
  return s;
}

Assistant:

glslang::TString& AppendTypeName(glslang::TString& s, const char* argOrder, const char* argType, int dim0, int dim1)
{
    const bool isTranspose = (argOrder[0] == '^');
    const bool isTexture   = IsTextureType(argOrder[0]);
    const bool isArrayed   = IsArrayed(argOrder[0]);
    const bool isSampler   = IsSamplerType(argType[0]);
    const bool isMS        = IsMS(argOrder[0]);
    const bool isBuffer    = IsBuffer(argOrder[0]);
    const bool isImage     = IsImage(argOrder[0]);
    const bool isSubpass   = IsSubpassInput(argOrder[0]);

    char type  = *argType;

    if (isTranspose) {  // Take transpose of matrix dimensions
        std::swap(dim0, dim1);
    } else if (isTexture || isSubpass) {
        if (type == 'F')       // map base type to texture of that type.
            type = 'T';        // e.g, int -> itexture, uint -> utexture, etc.
        else if (type == 'I')
            type = 'i';
        else if (type == 'U')
            type = 'u';
    }

    if (isTranspose)
        ++argOrder;

    char order = *argOrder;

    switch (type) {
    case '-': s += "void";                                break;
    case 'F': s += "float";                               break;
    case 'D': s += "double";                              break;
    case 'I': s += "int";                                 break;
    case 'U': s += "uint";                                break;
    case 'L': s += "int64_t";                             break;
    case 'M': s += "uint64_t";                            break;
    case 'B': s += "bool";                                break;
    case 'S': s += "sampler";                             break;
    case 's': s += "SamplerComparisonState";              break;
    case 'T': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage  ? "RWTexture" : "Texture");  break;
    case 'i': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    case 'u': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    default:  s += "UNKNOWN_TYPE";                        break;
    }

    if (isSubpass && isMS)
        s += "MS";

    // handle fixed vector sizes, such as float3, and only ever 3.
    const int fixedVecSize = FixedVecSize(argOrder);
    if (fixedVecSize != 0)
        dim0 = dim1 = fixedVecSize;

    const char dim0Char = ('0' + char(dim0));
    const char dim1Char = ('0' + char(dim1));

    // Add sampler dimensions
    if (isSampler || isTexture) {
        if ((order == 'V' || isTexture) && !isBuffer) {
            switch (dim0) {
            case 1: s += "1D";                   break;
            case 2: s += (isMS ? "2DMS" : "2D"); break;
            case 3: s += "3D";                   break;
            case 4: s += (type == 'S'? "CUBE" : "Cube"); break;
            default: s += "UNKNOWN_SAMPLER";     break;
            }
        }
    } else {
        // Non-sampler type:
        // verify dimensions
        if (((order == 'V' || order == 'M') && (dim0 < 1 || dim0 > 4)) ||
            (order == 'M' && (dim1 < 1 || dim1 > 4))) {
            s += "UNKNOWN_DIMENSION";
            return s;
        }

        switch (order) {
        case '-': break;  // no dimensions for voids
        case 'S': break;  // no dimensions on scalars
        case 'V':
            s += dim0Char;
            break;
        case 'M':
            s += dim0Char;
            s += 'x';
            s += dim1Char;
            break;
        default:
            break;
        }
    }

    // handle arrayed textures
    if (isArrayed)
        s += "Array";

    switch (type) {
    case 'i': s += "<int";   s += dim0Char; s += ">"; break;
    case 'u': s += "<uint";  s += dim0Char; s += ">"; break;
    case 'T': s += "<float"; s += dim0Char; s += ">"; break;
    default: break;
    }

    return s;
}